

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O0

Vec_Int_t * Gia_ManCollectReach(Gia_Man_t *p,int fOdd)

{
  int iVar1;
  Vec_Int_t *vNodes_00;
  Gia_Obj_t *pGVar2;
  Vec_Int_t *vNodes;
  uint local_18;
  int iDriver;
  int i;
  int fOdd_local;
  Gia_Man_t *p_local;
  
  iVar1 = Gia_ManObjNum(p);
  vNodes_00 = Vec_IntAlloc(iVar1);
  Gia_ManIncrementTravId(p);
  pGVar2 = Gia_ManConst0(p);
  Gia_ObjSetTravIdCurrent(p,pGVar2);
  for (local_18 = 0; iVar1 = Vec_IntSize(p->vCos), (int)local_18 < iVar1; local_18 = local_18 + 1) {
    pGVar2 = Gia_ManCo(p,local_18);
    iVar1 = Gia_ObjFaninId0p(p,pGVar2);
    if ((local_18 & 1) == fOdd) {
      Gia_ManCollectDfs_rec(p,iVar1,vNodes_00);
    }
  }
  return vNodes_00;
}

Assistant:

Vec_Int_t * Gia_ManCollectReach( Gia_Man_t * p, int fOdd )
{
    int i, iDriver;
    Vec_Int_t * vNodes = Vec_IntAlloc( Gia_ManObjNum(p) );
    Gia_ManIncrementTravId( p );
    Gia_ObjSetTravIdCurrent( p, Gia_ManConst0(p) );
    Gia_ManForEachCoDriverId( p, iDriver, i )
        if ( (i & 1) == fOdd )
            Gia_ManCollectDfs_rec( p, iDriver, vNodes );
    return vNodes;
}